

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agent.cpp
# Opt level: O0

void __thiscall
so_5::impl::state_switch_guard_t::state_switch_guard_t(state_switch_guard_t *this,agent_t *agent)

{
  allocator local_39;
  string local_38 [32];
  agent_t *local_18;
  agent_t *agent_local;
  state_switch_guard_t *this_local;
  
  this->m_agent = agent;
  this->m_previous_status = agent->m_current_status;
  local_18 = agent;
  if (agent->m_current_status == state_switch_in_progress) {
    agent_local = (agent_t *)this;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_38,
               "an attempt to switch agent state when another state switch operation is in progress for the same agent"
               ,&local_39);
    exception_t::raise(0x519f6c);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  local_18->m_current_status = state_switch_in_progress;
  return;
}

Assistant:

state_switch_guard_t(
		agent_t & agent )
		:	m_agent( agent )
		,	m_previous_status( agent.m_current_status )
	{
		if( agent_t::agent_status_t::state_switch_in_progress
				== agent.m_current_status ) 
			SO_5_THROW_EXCEPTION(
					rc_another_state_switch_in_progress,
					"an attempt to switch agent state when another state "
					"switch operation is in progress for the same agent" );

		agent.m_current_status = agent_t::agent_status_t::state_switch_in_progress;
	}